

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string_util.cpp
# Opt level: O2

void libtorrent::aux::parse_comma_separated_string
               (string *in,
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *out)

{
  ulong uVar1;
  ulong uVar2;
  ulong uVar3;
  ulong uVar4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::clear(out);
  for (uVar3 = 0; uVar1 = in->_M_string_length, uVar3 < uVar1; uVar3 = uVar3 + 1) {
    while (((uVar4 = uVar1, uVar3 < uVar1 &&
            (uVar2 = (ulong)(byte)(in->_M_dataplus)._M_p[uVar3], uVar4 = uVar3, uVar2 < 0x21)) &&
           ((0x100003e00U >> (uVar2 & 0x3f) & 1) != 0))) {
      uVar3 = uVar3 + 1;
    }
    uVar3 = ::std::__cxx11::string::find((char)in,0x2c);
    if (uVar3 == 0xffffffffffffffff) {
      uVar3 = in->_M_string_length;
    }
    uVar1 = uVar3;
    while (((uVar4 < uVar1 && (uVar2 = (ulong)(byte)(in->_M_dataplus)._M_p[uVar1 - 1], uVar2 < 0x21)
            ) && ((0x100003e00U >> (uVar2 & 0x3f) & 1) != 0))) {
      uVar1 = uVar1 - 1;
    }
    ::std::__cxx11::string::substr((ulong)&local_50,(ulong)in);
    ::std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)out,&local_50);
    ::std::__cxx11::string::~string((string *)&local_50);
  }
  return;
}

Assistant:

void parse_comma_separated_string(std::string const& in, std::vector<std::string>& out)
	{
		out.clear();

		std::string::size_type start = 0;
		std::string::size_type end = 0;

		while (start < in.size())
		{
			// skip leading spaces
			while (start < in.size()
				&& is_space(in[start]))
				++start;

			end = in.find_first_of(',', start);
			if (end == std::string::npos) end = in.size();

			// skip trailing spaces
			std::string::size_type soft_end = end;
			while (soft_end > start
				&& is_space(in[soft_end - 1]))
				--soft_end;

			out.push_back(in.substr(start, soft_end - start));
			start = end + 1;
		}
	}